

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O0

bool __thiscall QTreeViewPrivate::isIndexExpanded(QTreeViewPrivate *this,QModelIndex *idx)

{
  bool bVar1;
  bool bVar2;
  QModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  ItemFlag in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QModelIndex *in_stack_ffffffffffffffb8;
  bool local_32;
  QPersistentModelIndex local_18;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_10;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QModelIndex::flags((QModelIndex *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)
                  CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  bVar2 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_c);
  bVar1 = false;
  local_32 = false;
  if (bVar2) {
    bVar2 = QAbstractItemViewPrivate::isPersistent(in_RDI,in_stack_ffffffffffffffb8);
    local_32 = false;
    if (bVar2) {
      QPersistentModelIndex::QPersistentModelIndex(&local_18,in_RSI);
      bVar1 = true;
      local_32 = QSet<QPersistentModelIndex>::contains
                           ((QSet<QPersistentModelIndex> *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                            (QPersistentModelIndex *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  if (bVar1) {
    QPersistentModelIndex::~QPersistentModelIndex(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_32;
}

Assistant:

inline bool isIndexExpanded(const QModelIndex &idx) const {
        //We first check if the idx is a QPersistentModelIndex, because creating QPersistentModelIndex is slow
        return !(idx.flags() & Qt::ItemNeverHasChildren) && isPersistent(idx) && expandedIndexes.contains(idx);
    }